

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O1

QWidget * __thiscall QToolBox::widget(QToolBox *this,int index)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  if (-1 < index) {
    lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
    lVar2 = *(long *)(lVar1 + 0x278);
    uVar3 = *(long *)(lVar1 + 0x280) - lVar2 >> 3;
    if (index < (int)uVar3) {
      if ((uint)index < uVar3) {
        return *(QWidget **)(*(long *)(lVar2 + (ulong)(uint)index * 8) + 0x10);
      }
      widget();
    }
  }
  return (QWidget *)0x0;
}

Assistant:

QWidget *QToolBox::widget(int index) const
{
    Q_D(const QToolBox);
    if (index < 0 || index >= static_cast<int>(d->pageList.size()))
        return nullptr;
    return d->pageList[index]->widget;
}